

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

void __thiscall SimpleString::replace(SimpleString *this,char *to,char *with)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  TestMemoryAllocator *pTVar4;
  undefined4 extraout_var;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  SimpleString *this_00;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  SimpleString local_40;
  
  SimpleString(&local_40,to);
  sVar3 = count(this,&local_40);
  deallocateInternalBuffer(&local_40);
  if (sVar3 != 0) {
    uVar7 = 0;
    do {
      uVar14 = uVar7;
      uVar7 = uVar14 + 1;
    } while (this->buffer_[uVar14] != '\0');
    lVar12 = -uVar7;
    lVar8 = -1;
    do {
      lVar12 = lVar12 + sVar3;
      lVar6 = lVar8 + 1;
      lVar8 = lVar8 + 1;
    } while (to[lVar6] != '\0');
    uVar13 = -lVar12;
    lVar12 = -1;
    do {
      uVar13 = uVar13 + sVar3;
      lVar6 = lVar12 + 1;
      lVar12 = lVar12 + 1;
    } while (with[lVar6] != '\0');
    if (uVar13 < 2) {
      this_00 = this;
      deallocateInternalBuffer(this);
      this->bufferSize_ = 1;
      pcVar5 = getEmptyString(this_00);
    }
    else {
      pTVar4 = stringAllocator_;
      if (stringAllocator_ == (TestMemoryAllocator *)0x0) {
        pTVar4 = defaultNewArrayAllocator();
      }
      iVar2 = (*pTVar4->_vptr_TestMemoryAllocator[2])
                        (pTVar4,uVar13,
                         "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O3/CMake/cpputest/cpputest-src/src/CppUTest/SimpleString.cpp"
                         ,0x195);
      pcVar5 = (char *)CONCAT44(extraout_var,iVar2);
      if (uVar7 != 1) {
        lVar6 = 0;
        uVar7 = 0;
        do {
          if (lVar8 != 0) {
            lVar9 = 0;
            do {
              cVar1 = (this->buffer_ + uVar7)[lVar9];
              if ((cVar1 == '\0') || (cVar1 != to[lVar9])) {
                if (cVar1 != to[lVar9]) {
                  pcVar5[lVar6] = this->buffer_[uVar7];
                  lVar9 = 1;
                  lVar11 = 1;
                  goto LAB_00133662;
                }
                break;
              }
              lVar9 = lVar9 + 1;
            } while (lVar8 != lVar9);
          }
          lVar9 = lVar8;
          lVar11 = lVar12;
          if (lVar12 != -1 && pcVar5 != (char *)0x0) {
            lVar10 = 0;
            do {
              cVar1 = with[lVar10];
              pcVar5[lVar10 + lVar6] = cVar1;
              if (cVar1 == '\0') break;
              bVar15 = lVar12 != lVar10;
              lVar10 = lVar10 + 1;
            } while (bVar15);
          }
LAB_00133662:
          lVar6 = lVar6 + lVar11;
          uVar7 = uVar7 + lVar9;
        } while (uVar7 < uVar14);
      }
      pcVar5[uVar13 - 1] = '\0';
      deallocateInternalBuffer(this);
      this->bufferSize_ = uVar13;
    }
    this->buffer_ = pcVar5;
  }
  return;
}

Assistant:

void SimpleString::replace(const char* to, const char* with)
{
    size_t c = count(to);
    if (c == 0) {
        return;
    }
    size_t len = size();
    size_t tolen = StrLen(to);
    size_t withlen = StrLen(with);

    size_t newsize = len + (withlen * c) - (tolen * c) + 1;

    if (newsize > 1) {
        char* newbuf = allocStringBuffer(newsize, __FILE__, __LINE__);
        for (size_t i = 0, j = 0; i < len;) {
            if (StrNCmp(&getBuffer()[i], to, tolen) == 0) {
                StrNCpy(&newbuf[j], with, withlen + 1);
                j += withlen;
                i += tolen;
            }
            else {
                newbuf[j] = getBuffer()[i];
                j++;
                i++;
            }
        }
        newbuf[newsize - 1] = '\0';
        setInternalBufferTo(newbuf, newsize);
    }
    else
        setInternalBufferAsEmptyString();
}